

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mock_loader_impl.c
# Opt level: O1

function_interface function_mock_singleton(void)

{
  return &function_mock_singleton::mock_interface;
}

Assistant:

function_interface function_mock_singleton(void)
{
	static struct function_interface_type mock_interface = {
		&function_mock_interface_create,
		&function_mock_interface_invoke,
		&function_mock_interface_await,
		&function_mock_interface_destroy
	};

	return &mock_interface;
}